

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O3

Am_Point_List * __thiscall
Am_Point_List::Add(Am_Point_List *this,float x,float y,Am_Add_Position position,bool unique)

{
  Am_Point_Item **ppAVar1;
  int iVar2;
  undefined4 extraout_var;
  Am_Point_Item *pAVar3;
  Am_Point_List_Data *this_00;
  Am_Point_List_Data *pAVar4;
  
  this_00 = this->data;
  if (this_00 == (Am_Point_List_Data *)0x0) {
    this_00 = (Am_Point_List_Data *)operator_new(0x20);
    Am_Point_List_Data::Am_Point_List_Data(this_00);
  }
  else {
    if ((!unique) || ((this_00->super_Am_Wrapper).refs == 1)) goto LAB_001a29bd;
    iVar2 = (*(this_00->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])
                      (this_00);
    this_00 = (Am_Point_List_Data *)CONCAT44(extraout_var,iVar2);
    pAVar3 = this->item;
    pAVar4 = this_00;
    if (pAVar3 != (Am_Point_Item *)0x0) {
      do {
        pAVar3 = pAVar3->prev;
        ppAVar1 = &pAVar4->head;
        pAVar4 = (Am_Point_List_Data *)*ppAVar1;
      } while (pAVar3 != (Am_Point_Item *)0x0);
      this->item = *ppAVar1;
    }
  }
  this->data = this_00;
LAB_001a29bd:
  Am_Point_List_Data::Add(this_00,x,y,position);
  return this;
}

Assistant:

Am_Point_List &
Am_Point_List::Add(float x, float y, Am_Add_Position position, bool unique)
{
  if (data) {
    if (unique)
      data->Make_Unique(data, item);
  } else
    data = new Am_Point_List_Data();
  data->Add(x, y, position);
  return *this;
}